

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<unsigned_short,unsigned_short>
          (Thread *this,BinopFunc<unsigned_short,_unsigned_short> *f)

{
  unsigned_short uVar1;
  u8 i;
  long lVar2;
  Simd<unsigned_short,_(unsigned_char)__b_> SVar3;
  SR result;
  Simd<unsigned_short,_(unsigned_char)__b_> lhs;
  Simd<unsigned_short,_(unsigned_char)__b_> rhs;
  Simd<unsigned_short,_(unsigned_char)__b_> local_48;
  unsigned_short local_38 [8];
  unsigned_short local_28 [8];
  
  local_28 = (unsigned_short  [8])Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  SVar3 = Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  local_38[0] = SVar3.v[0];
  local_38[1] = SVar3.v[1];
  local_38[2] = SVar3.v[2];
  local_38[3] = SVar3.v[3];
  local_38[4] = SVar3.v[4];
  local_38[5] = SVar3.v[5];
  local_38[6] = SVar3.v[6];
  local_38[7] = SVar3.v[7];
  lVar2 = 0;
  do {
    uVar1 = (*f)(local_38[lVar2],local_28[lVar2]);
    local_48.v[lVar2] = uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,local_48);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}